

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O3

void gravity_fiber_reassign(gravity_fiber_t *fiber,gravity_closure_t *closure,uint16_t nargs)

{
  uint16_t uVar1;
  gravity_callframe_t *pgVar2;
  gravity_function_t *pgVar3;
  uint32_t *puVar4;
  
  pgVar2 = fiber->frames;
  pgVar2->closure = closure;
  pgVar3 = closure->f;
  if (pgVar3->tag == EXEC_TYPE_NATIVE) {
    puVar4 = (pgVar3->field_9).field_0.bytecode;
  }
  else {
    puVar4 = (uint32_t *)0x0;
  }
  pgVar2->ip = puVar4;
  pgVar2->dest = 0;
  pgVar2->stackstart = fiber->stack;
  fiber->nframes = 1;
  fiber->upvalues = (gravity_upvalue_t *)0x0;
  uVar1 = pgVar3->nparams;
  if (uVar1 <= nargs) {
    uVar1 = nargs;
  }
  fiber->stacktop = fiber->stacktop + (ulong)uVar1 + (ulong)pgVar3->nlocals + (ulong)pgVar3->ntemps;
  return;
}

Assistant:

void gravity_fiber_reassign (gravity_fiber_t *fiber, gravity_closure_t *closure, uint16_t nargs) {
    gravity_callframe_t *frame = &fiber->frames[0];
    frame->closure = closure;
    frame->ip = (closure->f->tag == EXEC_TYPE_NATIVE) ? closure->f->bytecode : NULL;

    frame->dest = 0;
    frame->stackstart = fiber->stack;

    fiber->nframes = 1;
    fiber->upvalues = NULL;

    // update stacktop in order to be GC friendly
    fiber->stacktop += FN_COUNTREG(closure->f, nargs);
}